

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu-flags.c
# Opt level: O1

void cpu_flags_get(void)

{
  uint *puVar1;
  int *piVar2;
  int *piVar3;
  long lVar4;
  bool bVar5;
  
  cpu_flags = 0;
  puVar1 = (uint *)cpuid_basic_info(0);
  piVar2 = (int *)cpuid(0x80000000);
  if (*puVar1 != 0) {
    piVar3 = (int *)cpuid_Version_info(1);
    if (*piVar3 != 0) {
      bVar5 = ((uint)piVar3[2] >> 0x1a & 1) != 0;
      cpu_flags = (uint)bVar5;
      if (((uint)piVar3[3] >> 9 & 1) != 0) {
        cpu_flags = (uint)(bVar5 | 2);
      }
    }
  }
  if (6 < *puVar1) {
    lVar4 = cpuid_Extended_Feature_Enumeration_info(7);
    if ((*(uint *)(lVar4 + 4) & 0x20) != 0) {
      cpu_flags = cpu_flags | 8;
    }
    if ((*(uint *)(lVar4 + 4) >> 0x10 & 1) != 0) {
      cpu_flags = cpu_flags | 0x10;
    }
  }
  if ((*piVar2 != 0) &&
     (piVar2 = (int *)cpuid(0x80000001), ((uint)piVar2[3] >> 0xb & 1) != 0 && *piVar2 != 0)) {
    cpu_flags = cpu_flags | 4;
  }
  return;
}

Assistant:

void cpu_flags_get(void)
{
    unsigned int ebx, ecx, edx;
    unsigned int level, level_ext;

    cpu_flags = 0;
    level     = get_cpuid(0, 0, &ebx, &ecx, &edx);
    level_ext = get_cpuid(1, 0, &ebx, &ecx, &edx);

    if (level >= 1 && get_cpuid(0, 1, &ebx, &ecx, &edx)) {
        if (edx & (1 << 26)) {
            cpu_flags |= X86_64_FEATURE_SSE2;
        }
        if (ecx & (1 << 9)) {
            cpu_flags |= X86_64_FEATURE_SSSE3;
        }
    }
    if (level >= 7 && get_cpuid_count(0, 7, 0, &ebx, &ecx, &edx)) {
        if (ebx & (1 << 5)) {
            cpu_flags |= X86_64_FEATURE_AVX2;
        }
        if (ebx & (1 << 16)) {
            cpu_flags |= X86_64_FEATURE_AVX512F;
        }
    }
    if (level_ext >= 1 && get_cpuid(1, 1, &ebx, &ecx, &edx)) {
        if (ecx & (1 << 11)) {
            cpu_flags |= X86_64_FEATURE_XOP;
        }
    }
    /* FIXME: check also OS support! */
}